

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::InsertHeavyRows(Codec *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint64_t *puVar7;
  ushort uVar8;
  uint16_t heavy_i;
  uint64_t column_bit;
  uint ge_column_j;
  uint64_t *ge_extra_row;
  uint8_t *extra_row;
  uint16_t ge_row_j;
  int pivot_j;
  uint16_t first_heavy_row;
  uint16_t column_count;
  uint first_heavy_pivot;
  Codec *this_local;
  
  first_heavy_pivot = this->_pivot_count;
  uVar1 = this->_defer_count;
  uVar2 = this->_mix_count;
  uVar8 = this->_defer_count + this->_dense_count;
  pivot_j = this->_pivot_count;
  while (pivot_j = pivot_j - 1, -1 < pivot_j) {
    uVar3 = this->_pivots[pivot_j];
    if (uVar8 <= uVar3) {
      if (this->_next_pivot <= (uint)pivot_j) {
        first_heavy_pivot = first_heavy_pivot - 1;
        this->_pivots[pivot_j] = this->_pivots[first_heavy_pivot];
        this->_pivots[first_heavy_pivot] = uVar3;
      }
      puVar6 = this->_heavy_matrix;
      uVar4 = this->_heavy_pitch;
      puVar7 = this->_ge_matrix;
      uVar5 = this->_ge_pitch;
      for (ge_column_j = this->_first_heavy_column; ge_column_j < (ushort)(uVar1 + uVar2);
          ge_column_j = ge_column_j + 1) {
        puVar6[(ulong)(ge_column_j - this->_first_heavy_column) +
               (ulong)(uVar4 * ((uint)uVar3 - (uint)uVar8))] =
             (byte)(puVar7[(ulong)(uVar5 * uVar3) + (ulong)(ge_column_j >> 6)] >>
                   ((byte)ge_column_j & 0x3f)) & 1;
      }
    }
  }
  this->_first_heavy_pivot = first_heavy_pivot;
  for (heavy_i = 0; heavy_i < 6; heavy_i = heavy_i + 1) {
    this->_pivots[this->_pivot_count + (uint)heavy_i] = uVar8 + this->_extra_count + heavy_i;
  }
  this->_pivot_count = this->_pivot_count + 6;
  return;
}

Assistant:

void Codec::InsertHeavyRows()
{
    CAT_IF_DUMP(cout << endl << "---- InsertHeavyRows ----" << endl << endl;)

    CAT_IF_DUMP(cout << "Converting remaining extra rows to heavy...";)

    // Initialize index of first heavy pivot
    unsigned first_heavy_pivot = _pivot_count;

    const uint16_t column_count = _defer_count + _mix_count;
    const uint16_t first_heavy_row = _defer_count + _dense_count;

    // For each remaining pivot in the list:
    for (int pivot_j = (int)_pivot_count - 1; pivot_j >= 0; --pivot_j)
    {
        CAT_DEBUG_ASSERT((unsigned)pivot_j < _pivot_count);
        const uint16_t ge_row_j = _pivots[pivot_j];

        // If row is extra:
        if (ge_row_j < first_heavy_row) {
            continue;
        }

        // If pivot is still unused:
        if ((unsigned)pivot_j >= _next_pivot)
        {
            CAT_DEBUG_ASSERT(first_heavy_pivot > 0);
            --first_heavy_pivot;

            // Swap pivot j into last heavy pivot position
            CAT_DEBUG_ASSERT(first_heavy_pivot < _pivot_count);
            _pivots[pivot_j] = _pivots[first_heavy_pivot];
            _pivots[first_heavy_pivot] = ge_row_j;
        }

        CAT_IF_DUMP(cout << " row=" << ge_row_j << ", pivot=" << pivot_j;)

        CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
        uint8_t * GF256_RESTRICT extra_row = _heavy_matrix + _heavy_pitch * (ge_row_j - first_heavy_row);
        const uint64_t * GF256_RESTRICT ge_extra_row = _ge_matrix + _ge_pitch * ge_row_j;

        // Copy heavy columns to heavy matrix row

        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            // Find bit for this column
            const uint64_t column_bit = (ge_extra_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1;

            // Set extra row byte to 0 or 1
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            extra_row[ge_column_j - _first_heavy_column] = static_cast<uint8_t>(column_bit);
        }
    }

    CAT_IF_DUMP(cout << endl;)

    // Store first heavy pivot index
    _first_heavy_pivot = first_heavy_pivot;

    // Add heavy rows at the end to cause them to be selected last if given a choice
    for (uint16_t heavy_i = 0; heavy_i < kHeavyRows; ++heavy_i) {
        // Use GE row index after extra count even if not all are used yet
        _pivots[_pivot_count + heavy_i] = first_heavy_row + _extra_count + heavy_i;
    }

    _pivot_count += kHeavyRows;

    CAT_IF_DUMP(cout << "Added heavy rows to the end of the pivots list." << endl;)
}